

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

int nni_sock_getopt(nni_sock *s,char *name,void *val,size_t *szp,nni_type t)

{
  int iVar1;
  
  nni_mtx_lock(&s->s_mx);
  iVar1 = 7;
  if (s->s_closing == false) {
    iVar1 = nni_getopt((s->s_sock_ops).sock_options,name,s->s_data,val,szp,t);
    if (iVar1 == 9) {
      iVar1 = nni_getopt(sock_options,name,s,val,szp,t);
    }
  }
  nni_mtx_unlock(&s->s_mx);
  return iVar1;
}

Assistant:

int
nni_sock_getopt(
    nni_sock *s, const char *name, void *val, size_t *szp, nni_type t)
{
	int rv;

	nni_mtx_lock(&s->s_mx);
	if (s->s_closing) {
		nni_mtx_unlock(&s->s_mx);
		return (NNG_ECLOSED);
	}

	// Protocol specific options.  The protocol can override
	// options like the send buffer or notification descriptors
	// this way.
	rv = nni_getopt(
	    s->s_sock_ops.sock_options, name, s->s_data, val, szp, t);
	if (rv != NNG_ENOTSUP) {
		nni_mtx_unlock(&s->s_mx);
		return (rv);
	}

	// Socket generic options.
	rv = nni_getopt(sock_options, name, s, val, szp, t);
	if (rv != NNG_ENOTSUP) {
		nni_mtx_unlock(&s->s_mx);
		return (rv);
	}

	nni_mtx_unlock(&s->s_mx);
	return (rv);
}